

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue key_00;
  JSValue key_01;
  JSValue v_00;
  JSValue v_01;
  int iVar1;
  int *piVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  uint in_R9D;
  JSValue JVar3;
  JSValue value;
  JSValue key;
  JSMapRecord *mr;
  JSMapState *s;
  JSContext *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  JSClassID in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion s_00;
  JSContext *ctx_00;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSMapRecord *local_50;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar3.tag = in_stack_ffffffffffffff80;
  JVar3.u.ptr = in_stack_ffffffffffffff78.ptr;
  piVar2 = (int *)JS_GetOpaque2((JSContext *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),JVar3,
                                in_stack_ffffffffffffff6c);
  if (piVar2 == (int *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    JVar3 = map_normalize_key(in_RDI,*in_R8);
    s_00 = JVar3.u;
    ctx_00 = (JSContext *)JVar3.tag;
    if ((*piVar2 == 0) || (iVar1 = JS_IsObject(JVar3), iVar1 != 0)) {
      if ((in_R9D & 1) == 0) {
        JVar4 = (JSValueUnion)in_R8[1].u.ptr;
        iVar5 = in_R8[1].tag;
      }
      else {
        in_stack_ffffffffffffff70 = 0;
        in_stack_ffffffffffffff78.float64 = 1.48219693752374e-323;
        JVar4.ptr = (void *)((ulong)in_stack_ffffffffffffff74 << 0x20);
        iVar5 = 3;
      }
      key_00.tag = (int64_t)ctx_00;
      key_00.u.ptr = s_00.ptr;
      local_50 = map_find_record((JSContext *)in_stack_ffffffffffffff78.ptr,
                                 (JSMapState *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 key_00);
      if (local_50 == (JSMapRecord *)0x0) {
        key_01.tag = iVar5;
        key_01.u.ptr = JVar4.ptr;
        local_50 = map_add_record(ctx_00,(JSMapState *)s_00.ptr,key_01);
        if (local_50 == (JSMapRecord *)0x0) {
          local_10.ptr = (void *)(local_10 << 0x20);
          local_8 = 6;
          return _local_10;
        }
      }
      else {
        v.u._4_4_ = in_stack_ffffffffffffff6c;
        v.u.int32 = in_stack_ffffffffffffff68;
        v.tag._0_4_ = in_stack_ffffffffffffff70;
        v.tag._4_4_ = in_stack_ffffffffffffff74;
        JS_FreeValue(in_stack_ffffffffffffff60,v);
      }
      v_00.tag = iVar5;
      v_00.u.ptr = JVar4.ptr;
      JVar3 = JS_DupValue(in_RDI,v_00);
      (local_50->value).u = JVar3.u;
      (local_50->value).tag = JVar3.tag;
      v_01.tag = in_RDX;
      v_01.u.float64 = in_RSI.float64;
      _local_10 = JS_DupValue(in_RDI,v_01);
    }
    else {
      _local_10 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x17dcec);
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_map_set(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key, value;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    if (s->is_weak && !JS_IsObject(key))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (magic & MAGIC_SET)
        value = JS_UNDEFINED;
    else
        value = argv[1];
    mr = map_find_record(ctx, s, key);
    if (mr) {
        JS_FreeValue(ctx, mr->value);
    } else {
        mr = map_add_record(ctx, s, key);
        if (!mr)
            return JS_EXCEPTION;
    }
    mr->value = JS_DupValue(ctx, value);
    return JS_DupValue(ctx, this_val);
}